

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::ShortPrint
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,ostream *out)

{
  long lVar1;
  TPZCompEl *this_00;
  char cVar2;
  TPZTransform<double> *pTVar3;
  ostream *poVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  long lVar7;
  _List_node_base *p_Var8;
  long lVar9;
  list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> restraints;
  TPZManVector<TPZTransform<double>,_10> tr;
  _List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> local_10a8;
  TPZManVector<TPZTransform<double>,_10> local_1090;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "virtual void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::ShortPrint(std::ostream &) const [TGeometry = pzgeom::TPZGeoCube]"
             ,0x79);
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\tMulti-physics element:: \n",0x1b);
  TPZCompEl::Print((TPZCompEl *)this,out);
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x1a0))
            ((_List_node_base *)&local_10a8,this);
  if (local_10a8._M_impl._M_node._M_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"One shape restraints\n",0x15);
    p_Var8 = (_List_node_base *)&local_10a8;
    while (p_Var8 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&local_10a8) {
      TPZOneShapeRestraint::Print((TPZOneShapeRestraint *)(p_Var8 + 1),out);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\n\tComputational elements within this multi-physics element: \n\n",0x3e);
  lVar1 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
  if (0 < lVar1) {
    lVar7 = 0xf0;
    lVar9 = 0;
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (out,"Computational element belonging to the mesh ",0x2c);
      poVar4 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
      this_00 = *(TPZCompEl **)
                 ((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar9);
      if (this_00 == (TPZCompEl *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,"There is not element to computational mesh ",0x2b);
        poVar4 = std::ostream::_M_insert<long>((long)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      else {
        (**(code **)(*(long *)this_00 + 0xd0))(this_00,out);
        pTVar5 = TPZCompEl::Reference(this_00);
        if (pTVar5 != (TPZGeoEl *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\tReference Index = ",0x13);
          TPZCompEl::Reference(this_00);
          std::ostream::_M_insert<long>((long)out);
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&local_1090,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this,&local_1090);
          std::__ostream_insert<char,std::char_traits<char>>
                    (out,
                     "\n\tAffine transformation of the multiphysics element for this computational element:"
                     ,0x53);
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
          pTVar3 = local_1090.super_TPZVec<TPZTransform<double>_>.fStore;
          std::__ostream_insert<char,std::char_traits<char>>(out,"mult = ",7);
          poVar4 = ::operator<<(out,(TPZMatrix<double> *)((long)pTVar3 + lVar7 + -0xe0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tsum = ",7);
          ::operator<<(poVar4,(TPZMatrix<double> *)
                              ((long)(pTVar3->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                              lVar7 + -0x68));
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&local_1090);
        }
      }
      lVar6 = lVar6 + 1;
      lVar9 = lVar9 + 0x10;
      lVar7 = lVar7 + 0x1a0;
    } while (lVar1 != lVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "---------------------------------------------------------------------------------------------------------------------------------------------------------------------------------\n"
             ,0xb2);
  std::__cxx11::_List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::_M_clear
            (&local_10a8);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::ShortPrint(std::ostream & out) const {

    out << __PRETTY_FUNCTION__ << std::endl;
    out << "\n\tMulti-physics element:: \n";
    TPZCompEl::Print(out);

    std::list<TPZOneShapeRestraint> restraints = this->GetShapeRestraints();
    if(restraints.size())
    {
        out << "One shape restraints\n";
        for (std::list<TPZOneShapeRestraint>::const_iterator it = restraints.begin(); it != restraints.end(); it++) {
            it->Print(out);
        }
    }

    out << "\n\tComputational elements within this multi-physics element: \n\n";
    int64_t nmesh  = fElementVec.size();
    for(int64_t iel = 0; iel< nmesh; iel++ ){

        out << "Computational element belonging to the mesh " << iel <<":\n";
        TPZCompEl *cel = fElementVec[iel].Element();
        if(!cel){
            out << "There is not element to computational mesh " << iel <<"\n";
            continue;
        }
        cel->ShortPrint(out);
        if(!cel->Reference()) continue;
        out << "\tReference Index = " << cel->Reference()->Index();

        TPZManVector<TPZTransform<> > tr;
        AffineTransform(tr);
        out << "\n\tAffine transformation of the multiphysics element for this computational element:"<<"\n";
        out << std::endl;
        out <<"\t" << tr[iel];
    }
    out << "---------------------------------------------------------------------------------------------------------------------------------------------------------------------------------\n";
}